

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

ER __thiscall slang::ast::ForLoopStatement::evalImpl(ForLoopStatement *this,EvalContext *context)

{
  bool bVar1;
  ConstantValue local_f0;
  Expression *local_c8;
  Expression *step;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ER result;
  ConstantValue result_1;
  ConstantValue local_68;
  Expression *local_40;
  Expression *init;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  EvalContext *context_local;
  ForLoopStatement *this_local;
  
  __begin2 = (iterator)&this->initializers;
  __range2 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)context;
  context_local = (EvalContext *)this;
  __end2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2);
  init = (Expression *)
         nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2);
  for (; (Expression *)__end2 != init; __end2 = __end2 + 1) {
    local_40 = *__end2;
    Expression::eval(&local_68,local_40,(EvalContext *)__range2);
    bVar1 = slang::ConstantValue::operator_cast_to_bool(&local_68);
    slang::ConstantValue::~ConstantValue(&local_68);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return Fail;
    }
  }
  do {
    if (this->stopExpr != (Expression *)0x0) {
      Expression::eval((ConstantValue *)&result,this->stopExpr,(EvalContext *)__range2);
      bVar1 = slang::ConstantValue::bad((ConstantValue *)&result);
      if (bVar1) {
        this_local._4_4_ = Fail;
        __range3._4_4_ = 1;
      }
      else {
        bVar1 = slang::ConstantValue::isTrue((ConstantValue *)&result);
        if (bVar1) {
          __range3._4_4_ = 0;
        }
        else {
          __range3._4_4_ = 5;
        }
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)&result);
      if (__range3._4_4_ != 0) {
        if (__range3._4_4_ != 1) {
          return Success;
        }
        return this_local._4_4_;
      }
    }
    __range3._0_4_ = Statement::eval(this->body,(EvalContext *)__range2);
    if ((ER)__range3 != Success) {
      if ((ER)__range3 == Break) {
        return Success;
      }
      if ((ER)__range3 != Continue) {
        return (ER)__range3;
      }
    }
    __begin3 = (iterator)&this->steps;
    __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
             begin((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin3);
    step = (Expression *)
           nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin3)
    ;
    for (; (Expression *)__end3 != step; __end3 = __end3 + 1) {
      local_c8 = *__end3;
      Expression::eval(&local_f0,local_c8,(EvalContext *)__range2);
      bVar1 = slang::ConstantValue::operator_cast_to_bool(&local_f0);
      slang::ConstantValue::~ConstantValue(&local_f0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return Fail;
      }
    }
  } while( true );
}

Assistant:

ER ForLoopStatement::evalImpl(EvalContext& context) const {
    for (auto init : initializers) {
        if (!init->eval(context))
            return ER::Fail;
    }

    while (true) {
        if (stopExpr) {
            auto result = stopExpr->eval(context);
            if (result.bad())
                return ER::Fail;

            if (!result.isTrue())
                break;
        }

        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }

        for (auto step : steps) {
            if (!step->eval(context))
                return ER::Fail;
        }
    }

    return ER::Success;
}